

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.cpp
# Opt level: O0

void __thiscall
ManagedDescriptor::ManagedDescriptor(ManagedDescriptor *this,ManagedDescriptor *other)

{
  bool bVar1;
  byte local_21;
  ManagedDescriptor *other_local;
  ManagedDescriptor *this_local;
  
  this->_descriptor = -1;
  this->_closedProperly = true;
  this->_file = (char *)0x0;
  this->_line = 0;
  this->_descriptor = other->_descriptor;
  other->_descriptor = -1;
  if ((this->_closedProperly & 1U) != 0) {
    bVar1 = isValid(this);
    if (bVar1) {
      local_21 = 0;
    }
    else {
      local_21 = other->_closedProperly;
    }
    this->_closedProperly = (bool)(local_21 & 1);
    other->_closedProperly = true;
    this->_file = other->_file;
    this->_line = other->_line;
    return;
  }
  __assert_fail("_closedProperly",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp"
                ,0xf6,"ManagedDescriptor::ManagedDescriptor(ManagedDescriptor &&)");
}

Assistant:

ManagedDescriptor(ManagedDescriptor&& other) {
    _descriptor = other._descriptor;
    other._descriptor = fdTraits::InvalidDescriptor;
#ifndef NDEBUG
    assert(_closedProperly);
    _closedProperly = isValid() ? false : other._closedProperly;
    other._closedProperly = true;
    _file = other._file;
    _line = other._line;
#endif
  }